

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::reset(QAbstractItemView *this)

{
  QKeyValueIterator<const_QPersistentModelIndex_&,_const_QEditorInfo_&,_QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator>
  rhs;
  QKeyValueIterator<const_QPersistentModelIndex_&,_const_QEditorInfo_&,_QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator>
  lhs;
  bool bVar1;
  QAbstractItemViewPrivate *editor;
  QItemSelectionModel *pQVar2;
  ulong uVar3;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QEditorInfo *info;
  QPersistentModelIndex *index;
  QKeyValueRange<const_QHash<QPersistentModelIndex,_QEditorInfo>_&> *__range1;
  QAbstractItemViewPrivate *d;
  const_key_value_iterator __end1;
  const_key_value_iterator __begin1;
  QIndexEditorHash copy;
  QAccessibleTableModelChangeEvent accessibleEvent;
  QAbstractItemViewPrivate *in_stack_fffffffffffffee8;
  State state;
  undefined4 in_stack_fffffffffffffef0;
  ModelChangeType in_stack_fffffffffffffef4;
  QWidget *in_stack_fffffffffffffef8;
  QEditorInfo *in_stack_ffffffffffffff08;
  QModelIndex *index_00;
  QAbstractItemViewPrivate *this_00;
  undefined1 local_c8 [48];
  pair<const_QPersistentModelIndex_&,_const_QEditorInfo_&> local_98;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *local_88;
  size_t local_80;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *local_78;
  size_t local_70;
  piter local_68;
  piter local_58;
  QKeyValueRangeStorage<const_QHash<QPersistentModelIndex,_QEditorInfo>_&> local_48;
  undefined1 *local_40;
  QAccessibleTableModelChangeEvent local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  editor = d_func((QAbstractItemView *)0x8021d0);
  QBasicTimer::stop();
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QHash<QPersistentModelIndex,_QEditorInfo>::QHash
            ((QHash<QPersistentModelIndex,_QEditorInfo> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (QHash<QPersistentModelIndex,_QEditorInfo> *)in_stack_fffffffffffffee8);
  local_48.m_map =
       (QHash<QPersistentModelIndex,_QEditorInfo> *)
       QHash<QPersistentModelIndex,_QEditorInfo>::asKeyValueRange
                 ((QHash<QPersistentModelIndex,_QEditorInfo> *)
                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  index_00 = (QModelIndex *)&local_48;
  local_58.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (piter)QtPrivate::QKeyValueRange<const_QHash<QPersistentModelIndex,_QEditorInfo>_&>::
                    begin((QKeyValueRange<const_QHash<QPersistentModelIndex,_QEditorInfo>_&> *)
                          0x802267);
  local_68.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (piter)QtPrivate::QKeyValueRange<const_QHash<QPersistentModelIndex,_QEditorInfo>_&>::
                    end((QKeyValueRange<const_QHash<QPersistentModelIndex,_QEditorInfo>_&> *)
                        0x80229f);
  while( true ) {
    local_78 = local_58.d;
    local_70 = local_58.bucket;
    local_88 = local_68.d;
    local_80 = local_68.bucket;
    lhs.i.i.bucket = (size_t)in_stack_ffffffffffffff08;
    lhs.i.i.d = (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)in_RDI;
    rhs.i.i.d._4_4_ = in_stack_fffffffffffffef4;
    rhs.i.i.d._0_4_ = in_stack_fffffffffffffef0;
    rhs.i.i.bucket = (size_t)in_stack_fffffffffffffef8;
    bVar1 = ::operator!=(lhs,rhs);
    state = (State)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (!bVar1) break;
    local_98 = QKeyValueIterator<const_QPersistentModelIndex_&,_const_QEditorInfo_&,_QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator>
               ::operator*((QKeyValueIterator<const_QPersistentModelIndex_&,_const_QEditorInfo_&,_QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator>
                            *)in_stack_ffffffffffffff08);
    std::get<0ul,QPersistentModelIndex_const&,QEditorInfo_const&>
              ((pair<const_QPersistentModelIndex_&,_const_QEditorInfo_&> *)0x80236f);
    in_stack_ffffffffffffff08 =
         std::get<1ul,QPersistentModelIndex_const&,QEditorInfo_const&>
                   ((pair<const_QPersistentModelIndex_&,_const_QEditorInfo_&> *)0x80238d);
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x80239c);
    if (bVar1) {
      in_stack_fffffffffffffef0 = SUB84(editor,0);
      in_stack_fffffffffffffef4 = (ModelChangeType)((ulong)editor >> 0x20);
      in_stack_fffffffffffffee8 = editor;
      in_stack_fffffffffffffef8 = QPointer<QWidget>::data((QPointer<QWidget> *)0x8023b6);
      editor = in_stack_fffffffffffffee8;
      QPointer<QWidget>::data((QPointer<QWidget> *)0x8023ce);
      QAbstractItemViewPrivate::indexForEditor(in_RDI,(QWidget *)editor);
      QAbstractItemViewPrivate::releaseEditor(this_00,(QWidget *)editor,index_00);
    }
    QKeyValueIterator<const_QPersistentModelIndex_&,_const_QEditorInfo_&,_QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator>
    ::operator++((QKeyValueIterator<const_QPersistentModelIndex_&,_const_QEditorInfo_&,_QHash<QPersistentModelIndex,_QEditorInfo>::const_iterator>
                  *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  QHash<QWidget_*,_QPersistentModelIndex>::clear
            ((QHash<QWidget_*,_QPersistentModelIndex> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  QHash<QPersistentModelIndex,_QEditorInfo>::clear
            ((QHash<QPersistentModelIndex,_QEditorInfo> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  QSet<QWidget_*>::clear((QSet<QWidget_*> *)0x80243a);
  editor->currentIndexSet = false;
  setState((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),state)
  ;
  QModelIndex::QModelIndex((QModelIndex *)0x80245c);
  (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate + 0x218))(in_RDI,local_c8);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x802480);
  if (bVar1) {
    pQVar2 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x802497);
    (**(code **)(*(long *)pQVar2 + 0x80))();
  }
  uVar3 = QAccessible::isActive();
  if ((uVar3 & 1) != 0) {
    memset(local_38,0xaa,0x30);
    QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)in_RDI,&in_stack_fffffffffffffef8->super_QObject,
               in_stack_fffffffffffffef4);
    QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_38);
  }
  QAbstractItemViewPrivate::updateGeometry
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  QHash<QPersistentModelIndex,_QEditorInfo>::~QHash
            ((QHash<QPersistentModelIndex,_QEditorInfo> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::reset()
{
    Q_D(QAbstractItemView);
    d->delayedReset.stop(); //make sure we stop the timer
    // Taking a copy because releaseEditor() eventurally calls deleteLater() on the
    // editor, which calls QCoreApplication::postEvent(), the latter may invoke unknown
    // code that may modify d->indexEditorHash.
    const auto copy = d->indexEditorHash;
    for (const auto &[index, info] : copy.asKeyValueRange()) {
        if (info.widget)
            d->releaseEditor(info.widget.data(), d->indexForEditor(info.widget.data()));
    }
    d->editorIndexHash.clear();
    d->indexEditorHash.clear();
    d->persistent.clear();
    d->currentIndexSet = false;
    setState(NoState);
    setRootIndex(QModelIndex());
    if (d->selectionModel)
        d->selectionModel->reset();
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->updateGeometry();
}